

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

int stbi_write_hdr_core(stbi__write_context *s,int x,int y,int comp,float *data)

{
  char cVar1;
  char cVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  undefined1 uVar6;
  long lVar7;
  undefined1 uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  undefined1 uVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  void *pvVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  float *pfVar21;
  byte bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  uchar scanlineheader [4];
  char header [66];
  char buffer [128];
  undefined1 local_1a5;
  undefined1 local_1a4;
  undefined1 local_1a3;
  char local_1a2;
  char local_1a1;
  float local_1a0;
  undefined4 local_19c;
  void *local_198;
  void *local_190;
  long local_188;
  void *local_180;
  ulong local_178;
  ulong local_170;
  uint local_164;
  uint local_160;
  int local_15c;
  uint local_158;
  uint local_154;
  char local_150 [4];
  char local_14c [4];
  long local_148;
  long local_140;
  float *local_138;
  ulong local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  undefined8 local_108 [8];
  undefined2 local_c8;
  char local_b8 [136];
  
  bVar22 = 0;
  iVar3 = 0;
  if (data != (float *)0x0 && (0 < x && 0 < y)) {
    local_138 = data;
    pvVar4 = malloc((ulong)(uint)(x * 4));
    puVar15 = &DAT_001b42d0;
    puVar16 = local_108;
    for (lVar7 = 8; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar16 = *puVar15;
      puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
      puVar16 = puVar16 + (ulong)bVar22 * -2 + 1;
    }
    local_c8 = 10;
    (*s->func)(s->context,local_108,0x41);
    iVar3 = sprintf(local_b8,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",(ulong)(uint)y,
                    (ulong)(uint)x);
    uVar10 = 0;
    (*s->func)(s->context,local_b8,iVar3);
    local_15c = comp * x;
    local_160 = (uint)x >> 8;
    local_164 = x - 0x8000;
    uVar13 = comp - 3;
    local_178 = (ulong)(uint)x;
    local_120 = local_178 + (long)pvVar4;
    local_140 = (ulong)(uint)(x * 2) + (long)pvVar4;
    local_118 = (ulong)(uint)(x * 3) + (long)pvVar4;
    lVar7 = local_178 - 3;
    local_128 = -local_178;
    local_148 = (long)comp << 2;
    local_180 = pvVar4;
    local_170 = (ulong)(uint)x;
    local_158 = y;
    local_154 = uVar13;
    local_110 = lVar7;
    do {
      lVar5 = local_140;
      uVar9 = ~(uint)uVar10 + local_158;
      if (stbi__flip_vertically_on_write == 0) {
        uVar9 = (uint)uVar10;
      }
      pfVar21 = local_138 + (int)(uVar9 * local_15c);
      local_19c = CONCAT13((char)local_170,CONCAT12((char)local_160,0x202));
      uVar11 = local_178;
      local_130 = uVar10;
      if (local_164 < 0xffff8008) {
        do {
          if (uVar13 < 2) {
            fVar23 = pfVar21[2];
            fVar25 = pfVar21[1];
            fVar26 = *pfVar21;
          }
          else {
            fVar23 = *pfVar21;
            fVar25 = fVar23;
            fVar26 = fVar23;
          }
          fVar24 = fVar25;
          if (fVar25 <= fVar23) {
            fVar24 = fVar23;
          }
          fVar27 = fVar26;
          if (fVar26 <= fVar24) {
            fVar27 = fVar24;
          }
          if (1e-32 <= fVar27) {
            local_190 = (void *)CONCAT44(local_190._4_4_,fVar23);
            local_198 = (void *)CONCAT44(local_198._4_4_,fVar25);
            local_188 = CONCAT44(local_188._4_4_,fVar26);
            local_1a0 = fVar27;
            fVar23 = frexpf(fVar27,(int *)local_150);
            fVar23 = (fVar23 * 256.0) / local_1a0;
            local_1a5 = (undefined1)(int)((float)local_188 * fVar23);
            local_1a4 = (undefined1)(int)(local_198._0_4_ * fVar23);
            local_1a3 = (undefined1)(int)(local_190._0_4_ * fVar23);
            local_1a2 = local_150[0] + -0x80;
          }
          else {
            local_1a4 = 0;
            local_1a5 = 0;
            local_1a2 = '\0';
            local_1a3 = 0;
          }
          (*s->func)(s->context,&local_1a5,4);
          pfVar21 = (float *)((long)pfVar21 + local_148);
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      else {
        lVar12 = 0;
        do {
          if (uVar13 < 2) {
            fVar23 = pfVar21[2];
            fVar25 = pfVar21[1];
            fVar26 = *pfVar21;
          }
          else {
            fVar23 = *pfVar21;
            fVar25 = fVar23;
            fVar26 = fVar23;
          }
          fVar24 = fVar25;
          if (fVar25 <= fVar23) {
            fVar24 = fVar23;
          }
          fVar27 = fVar26;
          if (fVar26 <= fVar24) {
            fVar27 = fVar24;
          }
          if (1e-32 <= fVar27) {
            local_190 = (void *)CONCAT44(local_190._4_4_,fVar23);
            local_198 = (void *)CONCAT44(local_198._4_4_,fVar25);
            local_188 = CONCAT44(local_188._4_4_,fVar26);
            local_1a0 = fVar27;
            fVar23 = frexpf(fVar27,(int *)local_14c);
            fVar23 = (fVar23 * 256.0) / local_1a0;
            uVar6 = (undefined1)(int)((float)local_188 * fVar23);
            uVar8 = (undefined1)(int)(local_198._0_4_ * fVar23);
            uVar14 = (undefined1)(int)(local_190._0_4_ * fVar23);
            cVar2 = local_14c[0] + -0x80;
          }
          else {
            uVar8 = 0;
            uVar6 = 0;
            cVar2 = '\0';
            uVar14 = 0;
          }
          *(undefined1 *)((long)local_180 + lVar12) = uVar6;
          *(undefined1 *)(local_120 + lVar12) = uVar8;
          *(undefined1 *)(lVar5 + lVar12) = uVar14;
          *(char *)(local_118 + lVar12) = cVar2;
          lVar12 = lVar12 + 1;
          pfVar21 = (float *)((long)pfVar21 + local_148);
        } while (local_128 + lVar12 != 0);
        (*s->func)(s->context,&local_19c,4);
        lVar5 = 0;
        pvVar4 = local_180;
        do {
          pvVar17 = (void *)(lVar5 * local_178 + (long)local_180);
          iVar3 = 0;
          local_198 = pvVar4;
          local_190 = pvVar17;
          local_188 = lVar5;
          do {
            iVar18 = (int)local_170;
            iVar20 = iVar18;
            if (iVar3 + 2 < iVar18) {
              lVar5 = (long)iVar3 + -1;
              iVar19 = iVar3;
              cVar2 = *(char *)((long)pvVar17 + (long)iVar3);
              do {
                cVar1 = *(char *)((long)local_198 + lVar5 + 2);
                if ((cVar2 == cVar1) &&
                   (iVar20 = iVar19, cVar2 == *(char *)((long)local_198 + lVar5 + 3))) break;
                iVar19 = iVar19 + 1;
                lVar5 = lVar5 + 1;
                cVar2 = cVar1;
                iVar20 = iVar18;
              } while (lVar5 < lVar7);
            }
            for (; iVar3 < iVar20; iVar3 = iVar3 + iVar18) {
              iVar18 = iVar20 - iVar3;
              if (0x7f < iVar20 - iVar3) {
                iVar18 = 0x80;
              }
              local_1a5 = (undefined1)iVar18;
              (*s->func)(s->context,&local_1a5,1);
              (*s->func)(s->context,(void *)((long)pvVar17 + (long)iVar3),iVar18);
              pvVar17 = local_190;
            }
            iVar18 = (int)local_170;
            if (iVar20 + 2 < iVar18) {
              lVar7 = (long)iVar20;
              iVar19 = iVar20 + 1;
              if (iVar20 + 1 < iVar18) {
                iVar19 = iVar18;
              }
              do {
                if (*(char *)((long)local_198 + lVar7) != *(char *)((long)pvVar17 + (long)iVar3)) {
                  iVar19 = (int)lVar7;
                  break;
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < (long)local_178);
              if (iVar3 < iVar19) {
                do {
                  iVar20 = iVar19 - iVar3;
                  if (0x7e < iVar19 - iVar3) {
                    iVar20 = 0x7f;
                  }
                  local_1a5 = *(undefined1 *)((long)pvVar17 + (long)iVar3);
                  local_1a1 = (char)iVar20 + -0x80;
                  (*s->func)(s->context,&local_1a1,1);
                  (*s->func)(s->context,&local_1a5,1);
                  iVar3 = iVar3 + iVar20;
                  pvVar17 = local_190;
                } while (iVar3 < iVar19);
              }
            }
            lVar7 = local_110;
          } while (iVar3 < (int)local_170);
          lVar5 = local_188 + 1;
          pvVar4 = (void *)((long)local_198 + local_178);
          uVar13 = local_154;
        } while (lVar5 != 4);
      }
      uVar9 = (int)local_130 + 1;
      uVar10 = (ulong)uVar9;
    } while (uVar9 != local_158);
    free(local_180);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int stbi_write_hdr_core(stbi__write_context *s, int x, int y, int comp, float *data)
{
   if (y <= 0 || x <= 0 || data == NULL)
      return 0;
   else {
      // Each component is stored separately. Allocate scratch space for full output scanline.
      unsigned char *scratch = (unsigned char *) STBIW_MALLOC(x*4);
      int i, len;
      char buffer[128];
      char header[] = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
      s->func(s->context, header, sizeof(header)-1);

#ifdef __STDC_WANT_SECURE_LIB__
      len = sprintf_s(buffer, sizeof(buffer), "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#else
      len = sprintf(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#endif
      s->func(s->context, buffer, len);

      for(i=0; i < y; i++)
         stbiw__write_hdr_scanline(s, x, comp, scratch, data + comp*x*(stbi__flip_vertically_on_write ? y-1-i : i));
      STBIW_FREE(scratch);
      return 1;
   }
}